

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O3

void CESkyCoord::ICRS2Observed
               (CESkyCoord *in_icrs,CESkyCoord *out_observed,CEDate *date,CEObserver *observer,
               CESkyCoord *observed_icrs,CEAngle *hour_angle)

{
  CESkyCoord obs_cirs;
  CESkyCoord tmp_cirs;
  CESkyCoord local_90;
  CESkyCoord local_60;
  
  CESkyCoord(&local_60);
  ICRS2CIRS(in_icrs,&local_60,date);
  CESkyCoord(&local_90);
  CIRS2Observed(&local_60,out_observed,date,observer,&local_90,hour_angle);
  if (observed_icrs != (CESkyCoord *)0x0) {
    CIRS2ICRS(&local_90,observed_icrs,date);
  }
  ~CESkyCoord(&local_90);
  ~CESkyCoord(&local_60);
  return;
}

Assistant:

void CESkyCoord::ICRS2Observed(const CESkyCoord& in_icrs,
                               CESkyCoord*       out_observed,
                               const CEDate&     date,
                               const CEObserver& observer,
                               CESkyCoord*       observed_icrs,
                               CEAngle*          hour_angle)
{
    // First convert the ICRS coordinates to CIRS coordinates
    CESkyCoord tmp_cirs;
    ICRS2CIRS(in_icrs, &tmp_cirs, date);

    // Now convert CIRS to Observed
    CESkyCoord obs_cirs;
    CIRS2Observed(tmp_cirs, out_observed,
                  date, observer, 
                  &obs_cirs, hour_angle);
    
    // Convert the apparent CIRS RA,Dec to ICRS RA,Dec
    if (observed_icrs != nullptr) {
        CIRS2ICRS(obs_cirs, observed_icrs, date);
    }

    return;
}